

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

int checkSanityOfKnownMonotone
              (Vec_Int_t *vKnownMonotone,Vec_Int_t *vCandMonotone,Vec_Int_t *vHintMonotone)

{
  long lVar1;
  
  if (0 < vKnownMonotone->nSize) {
    lVar1 = 0;
    do {
      printf("%d ",(ulong)(uint)vKnownMonotone->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vKnownMonotone->nSize);
  }
  putchar(10);
  if (0 < vCandMonotone->nSize) {
    lVar1 = 0;
    do {
      printf("%d ",(ulong)(uint)vCandMonotone->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vCandMonotone->nSize);
  }
  putchar(10);
  if (0 < vHintMonotone->nSize) {
    lVar1 = 0;
    do {
      printf("%d ",(ulong)(uint)vHintMonotone->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vHintMonotone->nSize);
  }
  putchar(10);
  return 1;
}

Assistant:

int checkSanityOfKnownMonotone( Vec_Int_t *vKnownMonotone, Vec_Int_t *vCandMonotone, Vec_Int_t *vHintMonotone )
{
	int iElem, i;

	Vec_IntForEachEntry( vKnownMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	Vec_IntForEachEntry( vCandMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	Vec_IntForEachEntry( vHintMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	return 1;
}